

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O0

void __thiscall MD5::encodeString(MD5 *this,char *str)

{
  size_t len_00;
  element_type *peVar1;
  size_t len;
  char *str_local;
  MD5 *this_local;
  
  len_00 = strlen(str);
  peVar1 = std::__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  (*peVar1->_vptr_QPDFCryptoImpl[3])();
  encodeDataIncrementally(this,str,len_00);
  peVar1 = std::__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  (*peVar1->_vptr_QPDFCryptoImpl[5])();
  return;
}

Assistant:

void
MD5::encodeString(char const* str)
{
    size_t len = strlen(str);
    crypto->MD5_init();
    encodeDataIncrementally(str, len);
    crypto->MD5_finalize();
}